

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::AddMinOrMaxEnumValue
          (SwiftGenerator *this,string *str,string *type)

{
  string current_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)str);
  CodeWriter::SetValue(&this->code_,type,&local_38);
  std::operator+(&bStack_b8,"{{ACCESS_TYPE}} static var ",type);
  std::operator+(&local_98,&bStack_b8,": {{ENUM_NAME}} { return .{{");
  std::operator+(&local_78,&local_98,type);
  std::operator+(&local_58,&local_78,"}} }");
  CodeWriter::operator+=(&this->code_,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&bStack_b8);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void AddMinOrMaxEnumValue(const std::string &str, const std::string &type) {
    const auto current_value = str;
    code_.SetValue(type, current_value);
    code_ += "{{ACCESS_TYPE}} static var " + type +
             ": {{ENUM_NAME}} { return .{{" + type + "}} }";
  }